

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidGetPotentialChildren(xmlElementContent *ctree,xmlChar **names,int *len,int max)

{
  xmlChar *pxVar1;
  int iVar2;
  int local_30;
  int i;
  int max_local;
  int *len_local;
  xmlChar **names_local;
  xmlElementContent *ctree_local;
  
  if (((ctree == (xmlElementContent *)0x0) || (names == (xmlChar **)0x0)) || (len == (int *)0x0)) {
    ctree_local._4_4_ = -1;
  }
  else if (*len < max) {
    switch(ctree->type) {
    case XML_ELEMENT_CONTENT_PCDATA:
      for (local_30 = 0; local_30 < *len; local_30 = local_30 + 1) {
        iVar2 = xmlStrEqual((xmlChar *)"#PCDATA",names[local_30]);
        if (iVar2 != 0) {
          return *len;
        }
      }
      iVar2 = *len;
      *len = iVar2 + 1;
      names[iVar2] = (xmlChar *)"#PCDATA";
      break;
    case XML_ELEMENT_CONTENT_ELEMENT:
      for (local_30 = 0; local_30 < *len; local_30 = local_30 + 1) {
        iVar2 = xmlStrEqual(ctree->name,names[local_30]);
        if (iVar2 != 0) {
          return *len;
        }
      }
      pxVar1 = ctree->name;
      iVar2 = *len;
      *len = iVar2 + 1;
      names[iVar2] = pxVar1;
      break;
    case XML_ELEMENT_CONTENT_SEQ:
      xmlValidGetPotentialChildren(ctree->c1,names,len,max);
      xmlValidGetPotentialChildren(ctree->c2,names,len,max);
      break;
    case XML_ELEMENT_CONTENT_OR:
      xmlValidGetPotentialChildren(ctree->c1,names,len,max);
      xmlValidGetPotentialChildren(ctree->c2,names,len,max);
    }
    ctree_local._4_4_ = *len;
  }
  else {
    ctree_local._4_4_ = *len;
  }
  return ctree_local._4_4_;
}

Assistant:

int
xmlValidGetPotentialChildren(xmlElementContent *ctree,
                             const xmlChar **names,
                             int *len, int max) {
    int i;

    if ((ctree == NULL) || (names == NULL) || (len == NULL))
        return(-1);
    if (*len >= max) return(*len);

    switch (ctree->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(BAD_CAST "#PCDATA", names[i])) return(*len);
	    names[(*len)++] = BAD_CAST "#PCDATA";
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(ctree->name, names[i])) return(*len);
	    names[(*len)++] = ctree->name;
	    break;
	case XML_ELEMENT_CONTENT_SEQ:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
	case XML_ELEMENT_CONTENT_OR:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
   }

   return(*len);
}